

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie_test.cc
# Opt level: O0

void hbtrie_reverse_iterator_test(void)

{
  hbtrie_result hVar1;
  int iVar2;
  btree_blk_ops *initial_key;
  filemgr_open_result fVar3;
  char *fname;
  filemgr_open_result fr;
  hbtrie_result hr;
  filemgr_config config;
  hbtrie_iterator hit;
  hbtrie trie;
  btreeblk_handle bhandle;
  filemgr *file;
  size_t keylen;
  char key_temp [256];
  char key [256];
  uint64_t v_out;
  uint64_t v;
  uint64_t i;
  int nodesize;
  int c;
  int n;
  int r;
  int vsize;
  int ksize;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  undefined8 in_stack_fffffffffffffb00;
  uint32_t nodesize_00;
  hbtrie_iterator *it;
  filemgr *in_stack_fffffffffffffb08;
  code *handle;
  undefined4 in_stack_fffffffffffffb10;
  int in_stack_fffffffffffffb14;
  uint uVar4;
  hbtrie *in_stack_fffffffffffffb18;
  hbtrie *in_stack_fffffffffffffb20;
  hbtrie_iterator *in_stack_fffffffffffffb28;
  hbtrie_iterator *it_00;
  btree_blk_ops *in_stack_fffffffffffffb30;
  void *in_stack_fffffffffffffb38;
  char *readkey;
  undefined4 local_478 [3];
  undefined4 local_46c;
  undefined1 local_468;
  undefined2 local_458;
  filemgr *local_298;
  size_t local_290;
  char local_288 [256];
  char local_188 [64];
  err_log_callback *in_stack_fffffffffffffeb8;
  filemgr_config *in_stack_fffffffffffffec0;
  filemgr_ops *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  hbtrie *local_78;
  ulong local_70;
  uint local_64;
  timeval local_10;
  
  nodesize_00 = (uint32_t)((ulong)in_stack_fffffffffffffb00 >> 0x20);
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  system("rm -rf  hbtrie_testfile");
  memleak_start();
  memset(local_478,0,0x60);
  local_478[0] = 0x100;
  local_468 = 8;
  local_46c = 8;
  local_458 = 8;
  readkey = "./hbtrie_testfile";
  get_filemgr_ops();
  fVar3 = filemgr_open(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0
                       ,in_stack_fffffffffffffeb8);
  local_298 = fVar3.file;
  btreeblk_init((btreeblk_handle *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                in_stack_fffffffffffffb08,nodesize_00);
  initial_key = btreeblk_get_ops();
  it = (hbtrie_iterator *)0x0;
  handle = _readkey_wrap_memory_itr;
  hbtrie_init(in_stack_fffffffffffffb20,(int)((ulong)in_stack_fffffffffffffb18 >> 0x20),
              (int)in_stack_fffffffffffffb18,in_stack_fffffffffffffb14,0x107540,(void *)0x0,
              in_stack_fffffffffffffb30,in_stack_fffffffffffffb38,(hbtrie_func_readkey *)readkey);
  for (local_70 = 0; local_70 < 0x1e; local_70 = local_70 + 1) {
    local_78 = (hbtrie *)
               (local_70 >> 0x38 | (local_70 & 0xff000000000000) >> 0x28 |
                (local_70 & 0xff0000000000) >> 0x18 | (local_70 & 0xff00000000) >> 8 |
                (local_70 & 0xff000000) << 8 | (local_70 & 0xff0000) << 0x18 |
                (local_70 & 0xff00) << 0x28 | local_70 << 0x38);
    sprintf(local_188,"key%06d",local_70 & 0xffffffff);
    strlen(local_188);
    hbtrie_insert((hbtrie *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),handle,
                  (int)((ulong)it >> 0x20),initial_key,(void *)0x10792e);
    btreeblk_end((btreeblk_handle *)handle);
  }
  local_64 = 0;
  hbtrie_iterator_init((hbtrie *)handle,it,initial_key,0x10797b);
  do {
    hVar1 = hbtrie_next(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
                        (size_t *)in_stack_fffffffffffffb18,
                        (void *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
    if (hVar1 != HBTRIE_RESULT_SUCCESS) {
      btreeblk_end((btreeblk_handle *)handle);
      hbtrie_iterator_free(it);
      if (local_64 != 0x1e) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                ,0x287);
        hbtrie_reverse_iterator_test::__test_pass = 0;
        if (local_64 != 0x1e) {
          __assert_fail("c == n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                        ,0x287,"void hbtrie_reverse_iterator_test()");
        }
      }
      local_64 = 0;
      hbtrie_iterator_init((hbtrie *)handle,it,initial_key,0x107c7f);
      while( true ) {
        hVar1 = hbtrie_prev(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
                            (size_t *)in_stack_fffffffffffffb18,
                            (void *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
        btreeblk_end((btreeblk_handle *)handle);
        if (hVar1 != HBTRIE_RESULT_SUCCESS) break;
        local_78 = (hbtrie *)
                   ((ulong)local_78 >> 0x38 | ((ulong)local_78 & 0xff000000000000) >> 0x28 |
                    ((ulong)local_78 & 0xff0000000000) >> 0x18 |
                    ((ulong)local_78 & 0xff00000000) >> 8 | ((ulong)local_78 & 0xff000000) << 8 |
                    ((ulong)local_78 & 0xff0000) << 0x18 | ((ulong)local_78 & 0xff00) << 0x28 |
                   (long)local_78 << 0x38);
        local_64 = local_64 + 1;
      }
      btreeblk_end((btreeblk_handle *)handle);
      hbtrie_iterator_free(it);
      if (local_64 != 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                ,0x294);
        hbtrie_reverse_iterator_test::__test_pass = 0;
        if (local_64 != 0) {
          __assert_fail("c == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                        ,0x294,"void hbtrie_reverse_iterator_test()");
        }
      }
      local_64 = 0;
      sprintf(local_188,"key%06d",0x3c);
      strlen(local_188);
      hbtrie_iterator_init((hbtrie *)handle,it,initial_key,0x107e81);
      do {
        hVar1 = hbtrie_prev(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
                            (size_t *)in_stack_fffffffffffffb18,
                            (void *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
        btreeblk_end((btreeblk_handle *)handle);
        if (hVar1 != HBTRIE_RESULT_SUCCESS) {
          btreeblk_end((btreeblk_handle *)handle);
          hbtrie_iterator_free(it);
          if (local_64 != 0x1e) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                    ,0x2a5);
            hbtrie_reverse_iterator_test::__test_pass = 0;
            if (local_64 != 0x1e) {
              __assert_fail("c == n",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                            ,0x2a5,"void hbtrie_reverse_iterator_test()");
            }
          }
          local_64 = 0;
          sprintf(local_188,"key%06dxx",0xf);
          it_00 = (hbtrie_iterator *)local_188;
          strlen(local_188);
          hbtrie_iterator_init((hbtrie *)handle,it,initial_key,0x1081f5);
          do {
            hVar1 = hbtrie_prev(it_00,in_stack_fffffffffffffb20,(size_t *)in_stack_fffffffffffffb18,
                                (void *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10
                                                ));
            btreeblk_end((btreeblk_handle *)handle);
            if (hVar1 != HBTRIE_RESULT_SUCCESS) {
              btreeblk_end((btreeblk_handle *)handle);
              hbtrie_iterator_free(it);
              uVar4 = local_64;
              if (local_64 != 0x10) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                        ,0x2b6);
                hbtrie_reverse_iterator_test::__test_pass = 0;
                if (local_64 != 0x10) {
                  __assert_fail("c == (n/2)+1",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                                ,0x2b6,"void hbtrie_reverse_iterator_test()");
                }
                in_stack_fffffffffffffb10 = 0x10;
              }
              local_64 = 0xffffffff;
              hbtrie_iterator_init((hbtrie *)handle,it,initial_key,0x108584);
              local_70 = 0;
              while( true ) {
                if (0x14 < local_70) {
                  local_70 = 0;
                  while( true ) {
                    if (9 < local_70) {
                      local_70 = 0;
                      while( true ) {
                        if (0x12 < local_70) {
                          hVar1 = hbtrie_next(it_00,in_stack_fffffffffffffb20,
                                              (size_t *)in_stack_fffffffffffffb18,
                                              (void *)CONCAT44(uVar4,in_stack_fffffffffffffb10));
                          btreeblk_end((btreeblk_handle *)handle);
                          if (hVar1 != HBTRIE_RESULT_FAIL) {
                            fprintf(_stderr,"Test failed: %s %d\n",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                                    ,0x2da);
                            hbtrie_reverse_iterator_test::__test_pass = 0;
                            if (hVar1 != HBTRIE_RESULT_FAIL) {
                              __assert_fail("hr == HBTRIE_RESULT_FAIL",
                                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                                            ,0x2da,"void hbtrie_reverse_iterator_test()");
                            }
                          }
                          hbtrie_iterator_free(it);
                          hbtrie_free((hbtrie *)0x108ed9);
                          btreeblk_free((btreeblk_handle *)CONCAT44(uVar4,in_stack_fffffffffffffb10)
                                       );
                          filemgr_close((filemgr *)hit.trie.last_map_chunk,
                                        (bool)hit.trie.cmp_args._23_1_,
                                        (char *)hit.trie.cmp_args.user_param,
                                        (err_log_callback *)hit.trie.cmp_args.cmp_func);
                          filemgr_shutdown();
                          memleak_end();
                          if (hbtrie_reverse_iterator_test::__test_pass == 0) {
                            fprintf(_stderr,"%s FAILED\n","HB+trie reverse iterator test");
                          }
                          else {
                            fprintf(_stderr,"%s PASSED\n","HB+trie reverse iterator test");
                          }
                          return;
                        }
                        local_64 = local_64 + 1;
                        hVar1 = hbtrie_next(it_00,in_stack_fffffffffffffb20,
                                            (size_t *)in_stack_fffffffffffffb18,
                                            (void *)CONCAT44(uVar4,in_stack_fffffffffffffb10));
                        if (hVar1 == HBTRIE_RESULT_FAIL) break;
                        btreeblk_end((btreeblk_handle *)handle);
                        local_78 = (hbtrie *)
                                   ((ulong)local_78 >> 0x38 |
                                    ((ulong)local_78 & 0xff000000000000) >> 0x28 |
                                    ((ulong)local_78 & 0xff0000000000) >> 0x18 |
                                    ((ulong)local_78 & 0xff00000000) >> 8 |
                                    ((ulong)local_78 & 0xff000000) << 8 |
                                    ((ulong)local_78 & 0xff0000) << 0x18 |
                                    ((ulong)local_78 & 0xff00) << 0x28 | (long)local_78 << 0x38);
                        sprintf(local_288,"key%06d",(ulong)local_64);
                        iVar2 = memcmp(local_188,local_288,local_290);
                        if (iVar2 != 0) {
                          fprintf(_stderr,"Test failed: %s %d\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                                  ,0x2d5);
                          hbtrie_reverse_iterator_test::__test_pass = 0;
                          iVar2 = memcmp(local_188,local_288,local_290);
                          if (iVar2 != 0) {
                            __assert_fail("!memcmp(key, key_temp, keylen)",
                                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                                          ,0x2d5,"void hbtrie_reverse_iterator_test()");
                          }
                        }
                        if (local_78 != (hbtrie *)(long)(int)local_64) {
                          fprintf(_stderr,"Test failed: %s %d\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                                  ,0x2d6);
                          hbtrie_reverse_iterator_test::__test_pass = 0;
                          if (local_78 != (hbtrie *)(long)(int)local_64) {
                            __assert_fail("v == (uint64_t)c",
                                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                                          ,0x2d6,"void hbtrie_reverse_iterator_test()");
                          }
                        }
                        local_70 = local_70 + 1;
                      }
                      fprintf(_stderr,"Test failed: %s %d\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                              ,0x2d1);
                      hbtrie_reverse_iterator_test::__test_pass = 0;
                      __assert_fail("hr != HBTRIE_RESULT_FAIL",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                                    ,0x2d1,"void hbtrie_reverse_iterator_test()");
                    }
                    local_64 = local_64 - 1;
                    hVar1 = hbtrie_prev(it_00,in_stack_fffffffffffffb20,
                                        (size_t *)in_stack_fffffffffffffb18,
                                        (void *)CONCAT44(uVar4,in_stack_fffffffffffffb10));
                    if (hVar1 == HBTRIE_RESULT_FAIL) break;
                    btreeblk_end((btreeblk_handle *)handle);
                    local_78 = (hbtrie *)
                               ((ulong)local_78 >> 0x38 |
                                ((ulong)local_78 & 0xff000000000000) >> 0x28 |
                                ((ulong)local_78 & 0xff0000000000) >> 0x18 |
                                ((ulong)local_78 & 0xff00000000) >> 8 |
                                ((ulong)local_78 & 0xff000000) << 8 |
                                ((ulong)local_78 & 0xff0000) << 0x18 |
                                ((ulong)local_78 & 0xff00) << 0x28 | (long)local_78 << 0x38);
                    sprintf(local_288,"key%06d",(ulong)local_64);
                    iVar2 = memcmp(local_188,local_288,local_290);
                    if (iVar2 != 0) {
                      fprintf(_stderr,"Test failed: %s %d\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                              ,0x2cb);
                      hbtrie_reverse_iterator_test::__test_pass = 0;
                      iVar2 = memcmp(local_188,local_288,local_290);
                      if (iVar2 != 0) {
                        __assert_fail("!memcmp(key, key_temp, keylen)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                                      ,0x2cb,"void hbtrie_reverse_iterator_test()");
                      }
                    }
                    if (local_78 != (hbtrie *)(long)(int)local_64) {
                      fprintf(_stderr,"Test failed: %s %d\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                              ,0x2cc);
                      hbtrie_reverse_iterator_test::__test_pass = 0;
                      if (local_78 != (hbtrie *)(long)(int)local_64) {
                        __assert_fail("v == (uint64_t)c",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                                      ,0x2cc,"void hbtrie_reverse_iterator_test()");
                      }
                    }
                    local_70 = local_70 + 1;
                  }
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                          ,0x2c7);
                  hbtrie_reverse_iterator_test::__test_pass = 0;
                  __assert_fail("hr != HBTRIE_RESULT_FAIL",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                                ,0x2c7,"void hbtrie_reverse_iterator_test()");
                }
                local_64 = local_64 + 1;
                hVar1 = hbtrie_next(it_00,in_stack_fffffffffffffb20,
                                    (size_t *)in_stack_fffffffffffffb18,
                                    (void *)CONCAT44(uVar4,in_stack_fffffffffffffb10));
                if (hVar1 == HBTRIE_RESULT_FAIL) break;
                btreeblk_end((btreeblk_handle *)handle);
                local_78 = (hbtrie *)
                           ((ulong)local_78 >> 0x38 | ((ulong)local_78 & 0xff000000000000) >> 0x28 |
                            ((ulong)local_78 & 0xff0000000000) >> 0x18 |
                            ((ulong)local_78 & 0xff00000000) >> 8 |
                            ((ulong)local_78 & 0xff000000) << 8 |
                            ((ulong)local_78 & 0xff0000) << 0x18 |
                            ((ulong)local_78 & 0xff00) << 0x28 | (long)local_78 << 0x38);
                sprintf(local_288,"key%06d",(ulong)local_64);
                iVar2 = memcmp(local_188,local_288,local_290);
                if (iVar2 != 0) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                          ,0x2c1);
                  hbtrie_reverse_iterator_test::__test_pass = 0;
                  iVar2 = memcmp(local_188,local_288,local_290);
                  if (iVar2 != 0) {
                    __assert_fail("!memcmp(key, key_temp, keylen)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                                  ,0x2c1,"void hbtrie_reverse_iterator_test()");
                  }
                }
                if (local_78 != (hbtrie *)(long)(int)local_64) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                          ,0x2c2);
                  hbtrie_reverse_iterator_test::__test_pass = 0;
                  if (local_78 != (hbtrie *)(long)(int)local_64) {
                    __assert_fail("v == (uint64_t)c",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                                  ,0x2c2,"void hbtrie_reverse_iterator_test()");
                  }
                }
                local_70 = local_70 + 1;
              }
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                      ,0x2bd);
              hbtrie_reverse_iterator_test::__test_pass = 0;
              __assert_fail("hr != HBTRIE_RESULT_FAIL",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                            ,0x2bd,"void hbtrie_reverse_iterator_test()");
            }
            local_78 = (hbtrie *)
                       ((ulong)local_78 >> 0x38 | ((ulong)local_78 & 0xff000000000000) >> 0x28 |
                        ((ulong)local_78 & 0xff0000000000) >> 0x18 |
                        ((ulong)local_78 & 0xff00000000) >> 8 | ((ulong)local_78 & 0xff000000) << 8
                        | ((ulong)local_78 & 0xff0000) << 0x18 | ((ulong)local_78 & 0xff00) << 0x28
                       | (long)local_78 << 0x38);
            sprintf(local_288,"key%06d",(ulong)(0xf - local_64));
            iVar2 = memcmp(local_188,local_288,local_290);
            if (iVar2 != 0) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                      ,0x2b0);
              hbtrie_reverse_iterator_test::__test_pass = 0;
              iVar2 = memcmp(local_188,local_288,local_290);
              if (iVar2 != 0) {
                __assert_fail("!memcmp(key, key_temp, keylen)",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                              ,0x2b0,"void hbtrie_reverse_iterator_test()");
              }
            }
            in_stack_fffffffffffffb20 = local_78;
            if (local_78 != (hbtrie *)(0xfU - (long)(int)local_64)) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                      ,0x2b1);
              hbtrie_reverse_iterator_test::__test_pass = 0;
              in_stack_fffffffffffffb18 = local_78;
              if (local_78 != (hbtrie *)(0xfU - (long)(int)local_64)) {
                __assert_fail("v == (uint64_t)(n/2)-c",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                              ,0x2b1,"void hbtrie_reverse_iterator_test()");
              }
            }
            local_64 = local_64 + 1;
          } while( true );
        }
        local_78 = (hbtrie *)
                   ((ulong)local_78 >> 0x38 | ((ulong)local_78 & 0xff000000000000) >> 0x28 |
                    ((ulong)local_78 & 0xff0000000000) >> 0x18 |
                    ((ulong)local_78 & 0xff00000000) >> 8 | ((ulong)local_78 & 0xff000000) << 8 |
                    ((ulong)local_78 & 0xff0000) << 0x18 | ((ulong)local_78 & 0xff00) << 0x28 |
                   (long)local_78 << 0x38);
        sprintf(local_288,"key%06d",(ulong)(0x1d - local_64));
        iVar2 = memcmp(local_188,local_288,local_290);
        if (iVar2 != 0) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                  ,0x29f);
          hbtrie_reverse_iterator_test::__test_pass = 0;
          iVar2 = memcmp(local_188,local_288,local_290);
          if (iVar2 != 0) {
            __assert_fail("!memcmp(key, key_temp, keylen)",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                          ,0x29f,"void hbtrie_reverse_iterator_test()");
          }
        }
        if (local_78 != (hbtrie *)(0x1dU - (long)(int)local_64)) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                  ,0x2a0);
          hbtrie_reverse_iterator_test::__test_pass = 0;
          if (local_78 != (hbtrie *)(0x1dU - (long)(int)local_64)) {
            __assert_fail("v == (uint64_t)n-c-1",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                          ,0x2a0,"void hbtrie_reverse_iterator_test()");
          }
        }
        local_64 = local_64 + 1;
      } while( true );
    }
    btreeblk_end((btreeblk_handle *)handle);
    local_78 = (hbtrie *)
               ((ulong)local_78 >> 0x38 | ((ulong)local_78 & 0xff000000000000) >> 0x28 |
                ((ulong)local_78 & 0xff0000000000) >> 0x18 | ((ulong)local_78 & 0xff00000000) >> 8 |
                ((ulong)local_78 & 0xff000000) << 8 | ((ulong)local_78 & 0xff0000) << 0x18 |
                ((ulong)local_78 & 0xff00) << 0x28 | (long)local_78 << 0x38);
    sprintf(local_288,"key%06d",(ulong)local_64);
    iVar2 = memcmp(local_188,local_288,local_290);
    if (iVar2 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
              ,0x281);
      hbtrie_reverse_iterator_test::__test_pass = 0;
      iVar2 = memcmp(local_188,local_288,local_290);
      if (iVar2 != 0) {
        __assert_fail("!memcmp(key, key_temp, keylen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                      ,0x281,"void hbtrie_reverse_iterator_test()");
      }
    }
    if (local_78 != (hbtrie *)(long)(int)local_64) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
              ,0x282);
      hbtrie_reverse_iterator_test::__test_pass = 0;
      if (local_78 != (hbtrie *)(long)(int)local_64) {
        __assert_fail("v == (uint64_t)c",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                      ,0x282,"void hbtrie_reverse_iterator_test()");
      }
    }
    local_64 = local_64 + 1;
  } while( true );
}

Assistant:

void hbtrie_reverse_iterator_test()
{
    TEST_INIT();

    int ksize = 8, vsize = 8, r, n=30, c;
    int nodesize = 256;
    uint64_t i, v, v_out;
    char key[256], key_temp[256];
    size_t keylen;
    struct filemgr *file;
    struct btreeblk_handle bhandle;
    struct hbtrie trie;
    struct hbtrie_iterator hit;
    struct filemgr_config config;
    hbtrie_result hr;
    filemgr_open_result fr;
    char *fname = (char *) "./hbtrie_testfile";

    r = system(SHELL_DEL" hbtrie_testfile");
    (void)r;
    memleak_start();

    memset(&config, 0, sizeof(config));
    config.blocksize = nodesize;
    config.options = FILEMGR_CREATE;
    config.chunksize = ksize;
    config.num_wal_shards = 8;

    fr = filemgr_open(fname, get_filemgr_ops(), &config, NULL);
    file = fr.file;

    btreeblk_init(&bhandle, file, nodesize);
    hbtrie_init(&trie, ksize, vsize, nodesize, BLK_NOT_FOUND,
        &bhandle, btreeblk_get_ops(), NULL, _readkey_wrap_memory_itr);

    for (i=0;i<(uint64_t)n;++i){
        v = _endian_encode(i);
        sprintf(key, HB_KEYSTR, (int)i);
        hbtrie_insert(&trie, key, strlen(key), &v, &v_out);
        btreeblk_end(&bhandle);
    }

    c = 0;
    hbtrie_iterator_init(&trie, &hit, NULL, 0);
    while( (hr=hbtrie_next(&hit, key, &keylen, &v)) == HBTRIE_RESULT_SUCCESS) {
        btreeblk_end(&bhandle);
        v = _endian_decode(v);
        sprintf(key_temp, HB_KEYSTR, (int)c);
        TEST_CHK(!memcmp(key, key_temp, keylen));
        TEST_CHK(v == (uint64_t)c);
        c++;
    }
    btreeblk_end(&bhandle);
    hbtrie_iterator_free(&hit);
    TEST_CHK(c == n);

    c = 0;
    hbtrie_iterator_init(&trie, &hit, NULL, 0);
    while(1) {
        hr=hbtrie_prev(&hit, key, &keylen, &v);
        btreeblk_end(&bhandle);
        if (hr != HBTRIE_RESULT_SUCCESS) break;
        v = _endian_decode(v);
        c++;
    }
    btreeblk_end(&bhandle);
    hbtrie_iterator_free(&hit);
    TEST_CHK(c == 0);

    c = 0;
    sprintf(key, HB_KEYSTR, (int)n*2);
    hbtrie_iterator_init(&trie, &hit, key, strlen(key));
    while(1) {
        hr=hbtrie_prev(&hit, key, &keylen, &v);
        btreeblk_end(&bhandle);
        if (hr != HBTRIE_RESULT_SUCCESS) break;
        v = _endian_decode(v);
        sprintf(key_temp, HB_KEYSTR, (int)(n-c-1));
        TEST_CHK(!memcmp(key, key_temp, keylen));
        TEST_CHK(v == (uint64_t)n-c-1);
        c++;
    }
    btreeblk_end(&bhandle);
    hbtrie_iterator_free(&hit);
    TEST_CHK(c == n);

    c = 0;
    sprintf(key, HB_KEYSTR"xx", (int)n/2);
    hbtrie_iterator_init(&trie, &hit, key, strlen(key));
    while(1) {
        hr=hbtrie_prev(&hit, key, &keylen, &v);
        btreeblk_end(&bhandle);
        if (hr != HBTRIE_RESULT_SUCCESS) break;
        v = _endian_decode(v);
        sprintf(key_temp, HB_KEYSTR, (int)((n/2)-c));
        TEST_CHK(!memcmp(key, key_temp, keylen));
        TEST_CHK(v == (uint64_t)(n/2)-c);
        c++;
    }
    btreeblk_end(&bhandle);
    hbtrie_iterator_free(&hit);
    TEST_CHK(c == (n/2)+1);

    c = -1;
    hbtrie_iterator_init(&trie, &hit, NULL, 0);
    for (i=0;i<21;++i){
        c++;
        hr=hbtrie_next(&hit, key, &keylen, &v);
        TEST_CHK(hr != HBTRIE_RESULT_FAIL);
        btreeblk_end(&bhandle);
        v = _endian_decode(v);
        sprintf(key_temp, HB_KEYSTR, (int)c);
        TEST_CHK(!memcmp(key, key_temp, keylen));
        TEST_CHK(v == (uint64_t)c);
    }
    for (i=0;i<10;++i){
        c--;
        hr=hbtrie_prev(&hit, key, &keylen, &v);
        TEST_CHK(hr != HBTRIE_RESULT_FAIL);
        btreeblk_end(&bhandle);
        v = _endian_decode(v);
        sprintf(key_temp, HB_KEYSTR, (int)c);
        TEST_CHK(!memcmp(key, key_temp, keylen));
        TEST_CHK(v == (uint64_t)c);
    }
    for (i=0;i<19;++i){
        c++;
        hr=hbtrie_next(&hit, key, &keylen, &v);
        TEST_CHK(hr != HBTRIE_RESULT_FAIL);
        btreeblk_end(&bhandle);
        v = _endian_decode(v);
        sprintf(key_temp, HB_KEYSTR, (int)c);
        TEST_CHK(!memcmp(key, key_temp, keylen));
        TEST_CHK(v == (uint64_t)c);
    }
    hr=hbtrie_next(&hit, key, &keylen, &v);
    btreeblk_end(&bhandle);
    TEST_CHK(hr == HBTRIE_RESULT_FAIL);
    hbtrie_iterator_free(&hit);

    hbtrie_free(&trie);
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();
    memleak_end();

    TEST_RESULT("HB+trie reverse iterator test");
}